

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:257:3)>
 __thiscall kj::defer<kj::stringifyStackTrace(kj::ArrayPtr<void*const>)::__1>(kj *this,Type *func)

{
  Type *func_00;
  undefined8 extraout_RDX;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:257:3)>
  DVar1;
  Type *func_local;
  
  func_00 = fwd<kj::stringifyStackTrace(kj::ArrayPtr<void*const>)::__1>(func);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++:257:3)>
  ::Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:257:3)>
              *)this,func_00);
  DVar1._8_8_ = extraout_RDX;
  DVar1.func.oldPreload = (String *)this;
  return DVar1;
}

Assistant:

_::Deferred<Func> defer(Func&& func) {
  // Returns an object which will invoke the given functor in its destructor.  The object is not
  // copyable but is movable with the semantics you'd expect.  Since the return type is private,
  // you need to assign to an `auto` variable.
  //
  // The KJ_DEFER macro provides slightly more convenient syntax for the common case where you
  // want some code to run at current scope exit.

  return _::Deferred<Func>(kj::fwd<Func>(func));
}